

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamRandomAccessController::OpenIndex
          (BamRandomAccessController *this,string *indexFilename,BamReaderPrivate *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  BamIndex *pBVar4;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  string message_1;
  string message;
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pBVar4 = BamIndexFactory::CreateIndexFromFilename(indexFilename,reader);
  if (pBVar4 == (BamIndex *)0x0) {
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"could not open index file: ","");
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,(ulong)(indexFilename->_M_dataplus)._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"BamRandomAccessController::OpenIndex","");
    SetErrorString(this,&local_d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return false;
    }
  }
  else {
    iVar3 = (*pBVar4->_vptr_BamIndex[5])(pBVar4,indexFilename);
    if ((char)iVar3 != '\0') {
      if (this->m_index != (BamIndex *)0x0) {
        (*this->m_index->_vptr_BamIndex[1])();
      }
      this->m_index = pBVar4;
      return true;
    }
    pcVar2 = (pBVar4->m_errorString)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (pBVar4->m_errorString)._M_string_length);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"could not load index data from file: ","");
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,(ulong)(indexFilename->_M_dataplus)._M_p);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_90.field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = plVar5[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_90._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar6;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"BamRandomAccessController::OpenIndex","");
    SetErrorString(this,&local_90,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return false;
    }
  }
  operator_delete(local_b0._M_dataplus._M_p);
  return false;
}

Assistant:

bool BamRandomAccessController::OpenIndex(const std::string& indexFilename,
                                          BamReaderPrivate* reader)
{

    // attempt create new index of type based on filename
    BamIndex* index = BamIndexFactory::CreateIndexFromFilename(indexFilename, reader);
    if (index == 0) {
        const std::string message = std::string("could not open index file: ") + indexFilename;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // attempt to load data from index file
    if (!index->Load(indexFilename)) {
        const std::string indexError = index->GetErrorString();
        const std::string message = std::string("could not load index data from file: ") +
                                    indexFilename + "\n\t" + indexError;
        SetErrorString("BamRandomAccessController::OpenIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(index);
    return true;
}